

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.h
# Opt level: O3

void __thiscall TaskSpec::TaskSpec(TaskSpec *this,TaskSpec *oth)

{
  pointer pcVar1;
  
  this->id_ = oth->id_;
  (this->conn_id_)._M_dataplus._M_p = (pointer)&(this->conn_id_).field_2;
  pcVar1 = (oth->conn_id_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->conn_id_,pcVar1,pcVar1 + (oth->conn_id_)._M_string_length);
  (this->request_str_)._M_dataplus._M_p = (pointer)&(this->request_str_).field_2;
  pcVar1 = (oth->request_str_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->request_str_,pcVar1,pcVar1 + (oth->request_str_)._M_string_length);
  this->epoch_ms_ = oth->epoch_ms_;
  (this->work_estimated_).super___atomic_base<unsigned_long>._M_i =
       (oth->work_estimated_).super___atomic_base<unsigned_long>._M_i;
  (this->work_done_).super___atomic_base<unsigned_long>._M_i =
       (oth->work_done_).super___atomic_base<unsigned_long>._M_i;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(&this->locks_,&oth->locks_);
  return;
}

Assistant:

TaskSpec(const TaskSpec &oth)
        : id_(oth.id_),
          conn_id_(oth.conn_id_),
          request_str_(oth.request_str_),
          epoch_ms_(oth.epoch_ms_),
          work_estimated_(oth.work_estimated_.load()),
          work_done_(oth.work_done_.load()),
          locks_(oth.locks_) {}